

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave.c
# Opt level: O3

void cave_connectors_free(connector *join)

{
  connector *pcVar1;
  connector *current;
  
  if (join != (connector *)0x0) {
    do {
      pcVar1 = join->next;
      mem_free(join->info);
      mem_free(join);
      join = pcVar1;
    } while (pcVar1 != (connector *)0x0);
  }
  return;
}

Assistant:

void cave_connectors_free(struct connector *join)
{
	while (join) {
		struct connector *current = join;

		join = current->next;
		mem_free(current->info);
		mem_free(current);
	}
}